

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O3

int r1fgkf_(int *ido,int *ip,int *l1,int *idl1,double *cc,double *c1,double *c2,int *in1,double *ch,
           double *ch2,int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  double *pdVar26;
  long lVar27;
  long lVar28;
  double *pdVar29;
  int iVar30;
  ulong uVar31;
  double *pdVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  double *pdVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  int iVar43;
  double *pdVar44;
  long lVar45;
  int iVar46;
  long lVar47;
  double *pdVar48;
  long lVar49;
  long lVar50;
  ulong uVar51;
  double *pdVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  long local_190;
  double *local_180;
  double *local_178;
  double *local_168;
  double *local_160;
  double *local_150;
  double *local_148;
  double *local_138;
  double *local_130;
  double *local_128;
  double *local_120;
  double *local_110;
  double *local_108;
  double *local_e8;
  double *local_d8;
  double *local_d0;
  double *local_c8;
  double *local_c0;
  double *local_b0;
  double *local_a8;
  
  iVar1 = *in1;
  lVar34 = (long)iVar1;
  iVar30 = *idl1;
  lVar16 = (long)iVar30;
  lVar24 = (long)~((iVar30 + 1) * iVar1);
  iVar2 = *ido;
  lVar36 = (long)iVar2;
  iVar14 = *l1;
  lVar25 = (long)iVar14;
  iVar23 = (iVar14 + 1) * iVar2 + 1;
  lVar27 = (long)~(iVar23 * iVar1);
  iVar3 = *ip;
  lVar40 = (long)iVar3;
  iVar15 = *in2;
  lVar28 = (long)iVar15;
  lVar17 = (long)~((iVar30 + 1) * iVar15);
  lVar18 = (long)~(iVar23 * iVar15);
  dVar56 = cos(6.283185307179586 / (double)iVar3);
  dVar57 = sin(6.283185307179586 / (double)iVar3);
  iVar23 = *ip;
  iVar8 = (iVar23 - ((int)(iVar23 + 1U) >> 0x1f)) + 1 >> 1;
  uVar9 = iVar23 + 2;
  uVar4 = *ido;
  iVar10 = (int)((uVar4 - ((int)(uVar4 - 1) >> 0x1f)) + -1) >> 1;
  lVar54 = (long)(int)uVar4;
  uVar5 = *idl1;
  uVar37 = (ulong)uVar5;
  if ((ulong)uVar4 == 1) {
    if (0 < (int)uVar5) {
      pdVar19 = c2 + (lVar16 + 1) * lVar34 + lVar24 + 1;
      pdVar26 = ch2 + (lVar16 + 1) * lVar28 + lVar17 + 1;
      do {
        *pdVar19 = *pdVar26;
        pdVar19 = pdVar19 + lVar34;
        pdVar26 = pdVar26 + lVar28;
        uVar37 = uVar37 - 1;
      } while (uVar37 != 0);
    }
  }
  else {
    if (0 < (int)uVar5) {
      pdVar19 = ch2 + (lVar16 + 1) * lVar28 + lVar17 + 1;
      pdVar26 = c2 + (lVar16 + 1) * lVar34 + lVar24 + 1;
      do {
        *pdVar19 = *pdVar26;
        pdVar19 = pdVar19 + lVar28;
        pdVar26 = pdVar26 + lVar34;
        uVar37 = uVar37 - 1;
      } while (uVar37 != 0);
    }
    iVar6 = *l1;
    if (1 < iVar23) {
      uVar37 = (ulong)(iVar6 + 1);
      uVar21 = (ulong)(iVar23 + 1U);
      lVar41 = (lVar25 * 2 + 1) * lVar36;
      pdVar19 = ch + (lVar41 + 1) * lVar28 + lVar18 + 1;
      lVar20 = lVar25 * lVar36 * lVar28;
      lVar47 = lVar36 * lVar28;
      pdVar26 = c1 + lVar27 + (lVar41 + 1) * lVar34 + 1;
      lVar53 = lVar25 * lVar36 * lVar34;
      lVar45 = lVar36 * lVar34;
      uVar31 = 2;
      do {
        pdVar29 = pdVar19;
        lVar55 = uVar37 - 1;
        pdVar32 = pdVar26;
        if (0 < iVar6) {
          do {
            *pdVar29 = *pdVar32;
            lVar55 = lVar55 + -1;
            pdVar29 = pdVar29 + lVar47;
            pdVar32 = pdVar32 + lVar45;
          } while (lVar55 != 0);
        }
        uVar31 = uVar31 + 1;
        pdVar19 = pdVar19 + lVar20;
        pdVar26 = pdVar26 + lVar53;
      } while (uVar31 != uVar21);
      if (iVar6 < iVar10) {
        if (1 < iVar23) {
          local_168 = ch + (lVar41 + 3) * lVar28 + lVar18 + 1;
          local_128 = c1 + (lVar41 + 3) * lVar34 + lVar27 + 1;
          iVar42 = (iVar14 * 2 + 1) * iVar2 + 2;
          iVar46 = iVar15 * iVar42;
          iVar42 = iVar42 * iVar1;
          iVar13 = 0;
          uVar31 = 2;
          do {
            if (0 < iVar6) {
              uVar51 = 1;
              local_180 = local_128;
              local_130 = local_168;
              iVar11 = iVar46;
              iVar12 = iVar42;
              do {
                if (2 < (int)uVar4) {
                  lVar41 = 3;
                  pdVar19 = local_130;
                  pdVar26 = local_180;
                  iVar33 = iVar12;
                  iVar43 = iVar11;
                  do {
                    ch[lVar18 + (long)iVar43 + 1] =
                         wa[(long)iVar13 + lVar41 + -3] * c1[lVar27 + (long)iVar33 + 1] +
                         wa[(long)iVar13 + lVar41 + -2] * *pdVar26;
                    *pdVar19 = wa[(long)iVar13 + lVar41 + -3] * *pdVar26 -
                               c1[lVar27 + (long)iVar33 + 1] * wa[(long)iVar13 + lVar41 + -2];
                    lVar41 = lVar41 + 2;
                    pdVar19 = pdVar19 + lVar28 * 2;
                    pdVar26 = pdVar26 + lVar34 * 2;
                    iVar43 = iVar43 + iVar15 * 2;
                    iVar33 = iVar33 + iVar1 * 2;
                  } while (lVar41 <= lVar54);
                }
                uVar51 = uVar51 + 1;
                local_130 = local_130 + lVar47;
                local_180 = local_180 + lVar45;
                iVar11 = iVar11 + iVar15 * iVar2;
                iVar12 = iVar12 + iVar1 * iVar2;
              } while (uVar51 != uVar37);
            }
            uVar31 = uVar31 + 1;
            iVar13 = iVar13 + uVar4;
            local_168 = local_168 + lVar20;
            local_128 = local_128 + lVar53;
            iVar46 = iVar46 + iVar15 * iVar14 * iVar2;
            iVar42 = iVar42 + iVar1 * iVar14 * iVar2;
          } while (uVar31 != uVar21);
        }
      }
      else if (1 < iVar23) {
        local_178 = c1 + (lVar41 + 3) * lVar34 + lVar27 + 1;
        local_150 = c1 + (lVar41 + 2) * lVar34 + lVar27 + 1;
        local_190 = 0;
        uVar31 = 2;
        iVar14 = 0;
        do {
          if (2 < (int)uVar4) {
            lVar22 = 3;
            pdVar19 = local_150;
            lVar55 = (long)iVar14;
            lVar50 = local_190;
            pdVar26 = local_178;
            do {
              if (0 < iVar6) {
                lVar39 = 0;
                lVar35 = uVar37 - 1;
                lVar49 = lVar50;
                do {
                  *(double *)((long)ch + lVar49 + lVar18 * 8 + (lVar41 + 2) * lVar28 * 8 + 8) =
                       wa[lVar55] * *(double *)((long)pdVar19 + lVar39) +
                       wa[lVar55 + 1] * *(double *)((long)pdVar26 + lVar39);
                  *(double *)((long)ch + lVar49 + lVar18 * 8 + (lVar41 + 3) * lVar28 * 8 + 8) =
                       wa[lVar55] * *(double *)((long)pdVar26 + lVar39) -
                       *(double *)((long)pdVar19 + lVar39) * wa[lVar55 + 1];
                  lVar49 = lVar49 + lVar47 * 8;
                  lVar39 = lVar39 + lVar45 * 8;
                  lVar35 = lVar35 + -1;
                } while (lVar35 != 0);
              }
              lVar22 = lVar22 + 2;
              lVar50 = lVar50 + lVar28 * 0x10;
              pdVar26 = pdVar26 + lVar34 * 2;
              pdVar19 = pdVar19 + lVar34 * 2;
              lVar55 = lVar55 + 2;
            } while (lVar22 <= lVar54);
          }
          uVar31 = uVar31 + 1;
          iVar14 = iVar14 + uVar4;
          local_190 = local_190 + lVar20 * 8;
          local_178 = local_178 + lVar53;
          local_150 = local_150 + lVar53;
        } while (uVar31 != uVar21);
      }
    }
    if (iVar10 < iVar6) {
      bVar7 = true;
      if (iVar23 < 3) goto LAB_001355ea;
      iVar14 = 2;
      if (2 < iVar8) {
        iVar14 = iVar8;
      }
      lVar47 = (((ulong)uVar9 - 2) * lVar25 + 1) * lVar36;
      lVar20 = lVar47 + 3;
      local_130 = c1 + lVar20 * lVar34 + lVar27 + 1;
      lVar45 = lVar25 * lVar36 * lVar34;
      lVar47 = lVar47 + 2;
      lVar53 = (lVar25 * 2 + 1) * lVar36;
      lVar41 = lVar53 + 3;
      lVar53 = lVar53 + 2;
      local_148 = ch + lVar20 * lVar28 + lVar18 + 1;
      lVar20 = lVar25 * lVar36 * lVar28;
      local_160 = c1 + lVar47 * lVar34 + lVar27 + 1;
      local_138 = ch + lVar47 * lVar28 + lVar18 + 1;
      local_178 = c1 + lVar41 * lVar34 + lVar27 + 1;
      local_150 = ch + lVar41 * lVar28 + lVar18 + 1;
      local_120 = c1 + lVar53 * lVar34 + lVar27 + 1;
      local_168 = ch + lVar53 * lVar28 + lVar18 + 1;
      uVar37 = 2;
      do {
        if (2 < (int)uVar4) {
          lVar41 = 3;
          pdVar19 = local_138;
          pdVar26 = local_130;
          pdVar29 = local_178;
          pdVar32 = local_150;
          pdVar38 = local_160;
          pdVar44 = local_148;
          pdVar48 = local_120;
          pdVar52 = local_168;
          do {
            if (0 < iVar6) {
              lVar55 = 0;
              lVar53 = 0;
              lVar47 = (ulong)(iVar6 + 1) - 1;
              do {
                *(double *)((long)pdVar48 + lVar53) =
                     *(double *)((long)pdVar52 + lVar55) + *(double *)((long)pdVar19 + lVar55);
                *(double *)((long)pdVar38 + lVar53) =
                     *(double *)((long)pdVar32 + lVar55) - *(double *)((long)pdVar44 + lVar55);
                *(double *)((long)pdVar29 + lVar53) =
                     *(double *)((long)pdVar32 + lVar55) + *(double *)((long)pdVar44 + lVar55);
                *(double *)((long)pdVar26 + lVar53) =
                     *(double *)((long)pdVar19 + lVar55) - *(double *)((long)pdVar52 + lVar55);
                lVar53 = lVar53 + lVar36 * lVar34 * 8;
                lVar55 = lVar55 + lVar36 * lVar28 * 8;
                lVar47 = lVar47 + -1;
              } while (lVar47 != 0);
            }
            lVar41 = lVar41 + 2;
            pdVar26 = pdVar26 + lVar34 * 2;
            pdVar44 = pdVar44 + lVar28 * 2;
            pdVar38 = pdVar38 + lVar34 * 2;
            pdVar19 = pdVar19 + lVar28 * 2;
            pdVar29 = pdVar29 + lVar34 * 2;
            pdVar32 = pdVar32 + lVar28 * 2;
            pdVar48 = pdVar48 + lVar34 * 2;
            pdVar52 = pdVar52 + lVar28 * 2;
          } while (lVar41 <= lVar54);
        }
        uVar37 = uVar37 + 1;
        local_130 = local_130 + -lVar45;
        local_148 = local_148 + -lVar20;
        local_160 = local_160 + -lVar45;
        local_138 = local_138 + -lVar20;
        local_178 = local_178 + lVar45;
        local_150 = local_150 + lVar20;
        local_120 = local_120 + lVar45;
        local_168 = local_168 + lVar20;
      } while (uVar37 != iVar14 + 1);
    }
    else {
      bVar7 = true;
      if (iVar23 < 3) goto LAB_001355ea;
      iVar14 = 2;
      if (2 < iVar8) {
        iVar14 = iVar8;
      }
      lVar47 = (((ulong)uVar9 - 2) * lVar25 + 1) * lVar36;
      lVar20 = lVar47 + 3;
      local_148 = c1 + lVar20 * lVar34 + lVar27 + 1;
      lVar45 = lVar25 * lVar36 * lVar34;
      lVar53 = lVar36 * lVar34;
      lVar55 = (lVar25 * 2 + 1) * lVar36;
      lVar41 = lVar55 + 3;
      lVar55 = lVar55 + 2;
      lVar47 = lVar47 + 2;
      local_160 = ch + lVar20 * lVar28 + lVar18 + 1;
      lVar50 = lVar25 * lVar36 * lVar28;
      lVar20 = lVar36 * lVar28;
      local_138 = c1 + lVar41 * lVar34 + lVar27 + 1;
      local_178 = ch + lVar41 * lVar28 + lVar18 + 1;
      local_150 = c1 + lVar55 * lVar34 + lVar27 + 1;
      local_120 = ch + lVar55 * lVar28 + lVar18 + 1;
      local_168 = c1 + lVar47 * lVar34 + lVar27 + 1;
      local_128 = ch + lVar47 * lVar28 + lVar18 + 1;
      uVar37 = 2;
      do {
        if (0 < iVar6) {
          uVar31 = 1;
          pdVar19 = local_148;
          pdVar26 = local_128;
          pdVar29 = local_160;
          pdVar32 = local_120;
          pdVar38 = local_178;
          pdVar44 = local_138;
          pdVar48 = local_168;
          pdVar52 = local_150;
          do {
            if (2 < (int)uVar4) {
              lVar55 = 3;
              lVar41 = 0;
              lVar47 = 0;
              do {
                *(double *)((long)pdVar52 + lVar47) =
                     *(double *)((long)pdVar32 + lVar41) + *(double *)((long)pdVar26 + lVar41);
                *(double *)((long)pdVar48 + lVar47) =
                     *(double *)((long)pdVar38 + lVar41) - *(double *)((long)pdVar29 + lVar41);
                *(double *)((long)pdVar44 + lVar47) =
                     *(double *)((long)pdVar38 + lVar41) + *(double *)((long)pdVar29 + lVar41);
                *(double *)((long)pdVar19 + lVar47) =
                     *(double *)((long)pdVar26 + lVar41) - *(double *)((long)pdVar32 + lVar41);
                lVar55 = lVar55 + 2;
                lVar47 = lVar47 + lVar34 * 0x10;
                lVar41 = lVar41 + lVar28 * 0x10;
              } while (lVar55 <= lVar54);
            }
            uVar31 = uVar31 + 1;
            pdVar19 = pdVar19 + lVar53;
            pdVar29 = pdVar29 + lVar20;
            pdVar44 = pdVar44 + lVar53;
            pdVar38 = pdVar38 + lVar20;
            pdVar52 = pdVar52 + lVar53;
            pdVar32 = pdVar32 + lVar20;
            pdVar48 = pdVar48 + lVar53;
            pdVar26 = pdVar26 + lVar20;
          } while (uVar31 != iVar6 + 1);
        }
        uVar37 = uVar37 + 1;
        local_148 = local_148 + -lVar45;
        local_160 = local_160 + -lVar50;
        local_138 = local_138 + lVar45;
        local_178 = local_178 + lVar50;
        local_150 = local_150 + lVar45;
        local_120 = local_120 + lVar50;
        local_168 = local_168 + -lVar45;
        local_128 = local_128 + -lVar50;
      } while (uVar37 != iVar14 + 1);
    }
  }
  bVar7 = true;
  if (2 < iVar23) {
    iVar14 = *l1;
    uVar37 = (ulong)uVar9;
    iVar15 = 2;
    if (2 < iVar8) {
      iVar15 = iVar8;
    }
    lVar20 = ((uVar37 - 2) * lVar25 + 1) * lVar36 + 1;
    pdVar26 = c1 + lVar20 * lVar34 + lVar27;
    lVar47 = lVar25 * lVar36 * lVar34;
    pdVar29 = ch + lVar18 + lVar20 * lVar28;
    lVar41 = lVar25 * lVar36 * lVar28;
    lVar20 = (lVar25 * 2 + 1) * lVar36 + 1;
    pdVar19 = c1 + lVar20 * lVar34 + lVar27;
    pdVar32 = ch + lVar18 + lVar20 * lVar28;
    uVar31 = 2;
    do {
      if (0 < iVar14) {
        lVar45 = 8;
        lVar20 = 8;
        lVar27 = (ulong)(iVar14 + 1) - 1;
        do {
          *(double *)((long)pdVar19 + lVar20) =
               *(double *)((long)pdVar32 + lVar45) + *(double *)((long)pdVar29 + lVar45);
          *(double *)((long)pdVar26 + lVar20) =
               *(double *)((long)pdVar29 + lVar45) - *(double *)((long)pdVar32 + lVar45);
          lVar20 = lVar20 + lVar36 * lVar34 * 8;
          lVar45 = lVar45 + lVar36 * lVar28 * 8;
          lVar27 = lVar27 + -1;
        } while (lVar27 != 0);
      }
      uVar31 = uVar31 + 1;
      pdVar26 = pdVar26 + -lVar47;
      pdVar29 = pdVar29 + -lVar41;
      pdVar19 = pdVar19 + lVar47;
      pdVar32 = pdVar32 + lVar41;
    } while (uVar31 != iVar15 + 1);
    if (iVar23 < 3) {
      bVar7 = true;
    }
    else {
      iVar14 = 3;
      if (3 < iVar8) {
        iVar14 = iVar8;
      }
      iVar15 = 2;
      if (2 < iVar8) {
        iVar15 = iVar8;
      }
      pdVar26 = ch2 + ((uVar37 - 2) * lVar16 + 1) * lVar28 + lVar17;
      lVar27 = lVar16 * 2 + 1;
      pdVar19 = ch2 + lVar27 * lVar28 + lVar17;
      lVar20 = (ulong)(uVar5 + 1) - 1;
      lVar41 = lVar16 * lVar34;
      dVar58 = 0.0;
      dVar60 = 1.0;
      uVar31 = 2;
      do {
        dVar59 = dVar58 * -dVar57;
        dVar58 = dVar60 * dVar57 + dVar56 * dVar58;
        dVar60 = dVar59 + dVar56 * dVar60;
        if (0 < (int)uVar5) {
          lVar45 = 8;
          pdVar29 = c2 + (lVar16 + 1) * lVar34 + 1;
          pdVar32 = c2 + ((long)(iVar23 * iVar30) + 1) * lVar34 + 1;
          lVar47 = lVar20;
          pdVar38 = c2 + ((long)(iVar30 * 2) + 1) * lVar34 + 1;
          do {
            *(double *)((long)pdVar19 + lVar45) = pdVar38[lVar24] * dVar60 + pdVar29[lVar24];
            *(double *)((long)pdVar26 + lVar45) = pdVar32[lVar24] * dVar58;
            lVar45 = lVar45 + lVar28 * 8;
            pdVar32 = pdVar32 + lVar34;
            pdVar38 = pdVar38 + lVar34;
            pdVar29 = pdVar29 + lVar34;
            lVar47 = lVar47 + -1;
          } while (lVar47 != 0);
        }
        if (4 < iVar23) {
          uVar21 = 3;
          pdVar29 = c2 + ((uVar37 - 3) * lVar16 + 1) * lVar34 + lVar24;
          pdVar32 = c2 + (lVar16 * 3 + 1) * lVar34 + lVar24;
          dVar59 = dVar58;
          dVar62 = dVar60;
          do {
            dVar61 = dVar59 * -dVar58;
            dVar59 = dVar62 * dVar58 + dVar60 * dVar59;
            dVar62 = dVar61 + dVar60 * dVar62;
            if (0 < (int)uVar5) {
              lVar53 = 8;
              lVar45 = 8;
              lVar47 = lVar20;
              do {
                *(double *)((long)pdVar19 + lVar45) =
                     *(double *)((long)pdVar32 + lVar53) * dVar62 +
                     *(double *)((long)pdVar19 + lVar45);
                *(double *)((long)pdVar26 + lVar45) =
                     *(double *)((long)pdVar29 + lVar53) * dVar59 +
                     *(double *)((long)pdVar26 + lVar45);
                lVar45 = lVar45 + lVar28 * 8;
                lVar53 = lVar53 + lVar34 * 8;
                lVar47 = lVar47 + -1;
              } while (lVar47 != 0);
            }
            uVar21 = uVar21 + 1;
            pdVar29 = pdVar29 + -lVar41;
            pdVar32 = pdVar32 + lVar41;
          } while (uVar21 != iVar14 + 1);
        }
        uVar31 = uVar31 + 1;
        pdVar26 = pdVar26 + -(lVar16 * lVar28);
        pdVar19 = pdVar19 + lVar16 * lVar28;
      } while (uVar31 != iVar15 + 1);
      bVar7 = true;
      if (2 < iVar23) {
        iVar30 = 2;
        if (2 < iVar8) {
          iVar30 = iVar8;
        }
        pdVar19 = c2 + lVar27 * lVar34 + lVar24 + 1;
        uVar37 = 2;
        do {
          lVar24 = (ulong)(uVar5 + 1) - 1;
          pdVar26 = pdVar19;
          pdVar29 = ch2 + (lVar16 + 1) * lVar28 + lVar17 + 1;
          if (0 < (int)uVar5) {
            do {
              *pdVar29 = *pdVar26 + *pdVar29;
              lVar24 = lVar24 + -1;
              pdVar26 = pdVar26 + lVar34;
              pdVar29 = pdVar29 + lVar28;
            } while (lVar24 != 0);
          }
          uVar37 = uVar37 + 1;
          pdVar19 = pdVar19 + lVar41;
          bVar7 = iVar23 < 3;
        } while (uVar37 != iVar30 + 1);
      }
    }
  }
LAB_001355ea:
  lVar16 = (long)(~((iVar3 + 1) * iVar2) * iVar1 + -1);
  uVar5 = *l1;
  if ((int)uVar4 < (int)uVar5) {
    if (0 < (int)uVar4) {
      pdVar29 = cc + ((lVar40 + 1) * lVar36 + 1) * lVar34 + lVar16 + 1;
      pdVar32 = ch + ((lVar25 + 1) * lVar36 + 1) * lVar28 + lVar18 + 1;
      lVar24 = (ulong)(uVar5 + 1) - 1;
      lVar27 = 1;
      lVar17 = lVar24;
      pdVar19 = pdVar32;
      pdVar26 = pdVar29;
      do {
        do {
          *pdVar29 = *pdVar32;
          pdVar29 = pdVar29 + lVar40 * lVar36 * lVar34;
          pdVar32 = pdVar32 + lVar36 * lVar28;
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
        lVar27 = lVar27 + 1;
        pdVar29 = pdVar26 + lVar34;
        pdVar32 = pdVar19 + lVar28;
        lVar17 = lVar24;
        pdVar19 = pdVar32;
        pdVar26 = pdVar29;
      } while (lVar27 != (ulong)uVar4 + 1);
    }
  }
  else if (0 < (int)uVar5) {
    pdVar29 = cc + ((lVar40 + 1) * lVar36 + 1) * lVar34 + lVar16 + 1;
    pdVar32 = ch + ((lVar25 + 1) * lVar36 + 1) * lVar28 + lVar18 + 1;
    lVar24 = (ulong)(uVar4 + 1) - 1;
    lVar27 = 1;
    lVar17 = lVar24;
    pdVar19 = pdVar32;
    pdVar26 = pdVar29;
    do {
      do {
        *pdVar29 = *pdVar32;
        pdVar29 = pdVar29 + lVar34;
        pdVar32 = pdVar32 + lVar28;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
      lVar27 = lVar27 + 1;
      pdVar29 = pdVar26 + lVar40 * lVar36 * lVar34;
      pdVar32 = pdVar19 + lVar36 * lVar28;
      lVar17 = lVar24;
      pdVar19 = pdVar32;
      pdVar26 = pdVar29;
    } while (lVar27 != (ulong)uVar5 + 1);
  }
  if (!bVar7) {
    iVar30 = 2;
    if (2 < iVar8) {
      iVar30 = iVar8;
    }
    pdVar19 = ch + ((((ulong)uVar9 - 2) * lVar25 + 1) * lVar36 + 1) * lVar28 + 1;
    lVar24 = lVar36 * lVar28;
    lVar27 = lVar16 * 8 + ((lVar40 + 3) * lVar36 + 1) * lVar34 * 8 + 8;
    lVar20 = lVar36 * lVar34 * 0x10;
    lVar17 = lVar16 * 8 + ((lVar40 + 2) * lVar36 + lVar54) * lVar34 * 8 + 8;
    pdVar26 = ch + ((lVar25 * 2 + 1) * lVar36 + 1) * lVar28 + 1;
    uVar37 = 2;
    do {
      pdVar29 = pdVar26;
      pdVar32 = pdVar19;
      pdVar38 = cc;
      lVar41 = (ulong)(uVar5 + 1) - 1;
      if (0 < (int)uVar5) {
        do {
          *(double *)((long)pdVar38 + lVar17) = pdVar29[lVar18];
          *(double *)((long)pdVar38 + lVar27) = pdVar32[lVar18];
          lVar41 = lVar41 + -1;
          pdVar29 = pdVar29 + lVar24;
          pdVar32 = pdVar32 + lVar24;
          pdVar38 = pdVar38 + lVar36 * lVar34 * lVar40;
        } while (lVar41 != 0);
      }
      uVar37 = uVar37 + 1;
      pdVar19 = pdVar19 + -(lVar24 * lVar25);
      lVar27 = lVar27 + lVar20;
      lVar17 = lVar17 + lVar20;
      pdVar26 = pdVar26 + lVar24 * lVar25;
    } while (uVar37 != iVar30 + 1);
  }
  if (uVar4 != 1) {
    if (iVar10 < (int)uVar5) {
      if (!bVar7) {
        iVar30 = 2;
        if (2 < iVar8) {
          iVar30 = iVar8;
        }
        lVar27 = lVar36 * lVar34;
        lVar17 = (lVar40 + 3) * lVar36;
        local_120 = cc + ((long)(int)(uVar4 + 2) + (lVar40 + 2) * lVar36 + -4) * lVar34 + lVar16;
        local_e8 = cc + (lVar17 + 3) * lVar34 + lVar16;
        local_c0 = cc + (lVar17 + 2) * lVar34 + lVar16;
        lVar17 = (((ulong)uVar9 - 2) * lVar25 + 1) * lVar36;
        lVar24 = lVar36 * lVar28 * lVar25;
        lVar25 = (lVar25 * 2 + 1) * lVar36;
        local_108 = ch + (lVar17 + 3) * lVar28 + lVar18 + 1;
        local_b0 = ch + (lVar17 + 2) * lVar28 + lVar18 + 1;
        local_168 = ch + (lVar25 + 3) * lVar28 + lVar18 + 1;
        local_128 = ch + (lVar25 + 2) * lVar28 + lVar18 + 1;
        iVar14 = (uVar4 + (iVar3 + 2) * iVar2 + -1) * iVar1;
        uVar37 = 2;
        do {
          if (2 < (int)uVar4) {
            lVar17 = 3;
            pdVar19 = local_120;
            pdVar26 = local_168;
            pdVar29 = local_108;
            pdVar32 = local_128;
            pdVar38 = local_c0;
            pdVar44 = local_e8;
            pdVar48 = local_b0;
            iVar15 = iVar14;
            do {
              if (0 < (int)uVar5) {
                lVar25 = 8;
                lVar20 = 0;
                lVar18 = (ulong)(uVar5 + 1) - 1;
                iVar23 = iVar15;
                do {
                  *(double *)((long)pdVar38 + lVar25) =
                       *(double *)((long)pdVar32 + lVar20) + *(double *)((long)pdVar48 + lVar20);
                  *(double *)((long)pdVar19 + lVar25) =
                       *(double *)((long)pdVar32 + lVar20) - *(double *)((long)pdVar48 + lVar20);
                  *(double *)((long)pdVar44 + lVar25) =
                       *(double *)((long)pdVar26 + lVar20) + *(double *)((long)pdVar29 + lVar20);
                  cc[lVar16 + (long)iVar23 + 1] =
                       *(double *)((long)pdVar29 + lVar20) - *(double *)((long)pdVar26 + lVar20);
                  iVar23 = iVar23 + iVar1 * iVar3 * iVar2;
                  lVar25 = lVar25 + lVar27 * lVar40 * 8;
                  lVar20 = lVar20 + lVar36 * lVar28 * 8;
                  lVar18 = lVar18 + -1;
                } while (lVar18 != 0);
              }
              lVar17 = lVar17 + 2;
              iVar15 = iVar15 + iVar1 * -2;
              pdVar19 = pdVar19 + lVar34 * -2;
              pdVar44 = pdVar44 + lVar34 * 2;
              pdVar38 = pdVar38 + lVar34 * 2;
              pdVar29 = pdVar29 + lVar28 * 2;
              pdVar48 = pdVar48 + lVar28 * 2;
              pdVar26 = pdVar26 + lVar28 * 2;
              pdVar32 = pdVar32 + lVar28 * 2;
            } while (lVar17 <= lVar54);
          }
          uVar37 = uVar37 + 1;
          iVar14 = iVar14 + iVar1 * iVar2 * 2;
          local_120 = local_120 + lVar27 * 2;
          local_e8 = local_e8 + lVar27 * 2;
          local_c0 = local_c0 + lVar27 * 2;
          local_108 = local_108 + -lVar24;
          local_b0 = local_b0 + -lVar24;
          local_168 = local_168 + lVar24;
          local_128 = local_128 + lVar24;
        } while (uVar37 != iVar30 + 1);
      }
    }
    else if (!bVar7) {
      iVar30 = 2;
      if (2 < iVar8) {
        iVar30 = iVar8;
      }
      lVar27 = (lVar40 + 3) * lVar36;
      lVar47 = lVar36 * lVar34;
      lVar45 = lVar47 * lVar40;
      lVar20 = (((ulong)uVar9 - 2) * lVar25 + 1) * lVar36;
      lVar41 = lVar36 * lVar28;
      lVar24 = lVar41 * lVar25;
      lVar17 = (lVar25 * 2 + 1) * lVar36;
      local_168 = ch + (lVar20 + 3) * lVar28 + lVar18 + 1;
      local_128 = ch + (lVar17 + 3) * lVar28 + lVar18 + 1;
      local_110 = ch + (lVar17 + 2) * lVar28 + lVar18 + 1;
      local_c8 = ch + (lVar20 + 2) * lVar28 + lVar18 + 1;
      local_d0 = cc + (lVar27 + 3) * lVar34 + lVar16 + 1;
      local_d8 = cc + ((long)(int)(uVar4 + 2) + (lVar40 + 2) * lVar36 + -3) * lVar34 + lVar16 + 1;
      local_a8 = cc + (lVar27 + 2) * lVar34 + lVar16 + 1;
      iVar14 = (uVar4 + (iVar3 + 2) * iVar2 + -2) * iVar1;
      uVar37 = 2;
      do {
        if (0 < (int)uVar5) {
          uVar31 = 1;
          local_148 = local_d8;
          pdVar19 = local_a8;
          pdVar26 = local_c8;
          pdVar29 = local_168;
          pdVar32 = local_110;
          pdVar38 = local_d0;
          pdVar44 = local_128;
          iVar15 = iVar14;
          do {
            if (2 < (int)uVar4) {
              lVar17 = 3;
              lVar25 = 0;
              lVar18 = 0;
              pdVar48 = local_148;
              iVar23 = iVar15;
              do {
                *(double *)((long)pdVar19 + lVar18) =
                     *(double *)((long)pdVar32 + lVar25) + *(double *)((long)pdVar26 + lVar25);
                cc[lVar16 + (long)iVar23 + 1] =
                     *(double *)((long)pdVar32 + lVar25) - *(double *)((long)pdVar26 + lVar25);
                *(double *)((long)pdVar38 + lVar18) =
                     *(double *)((long)pdVar44 + lVar25) + *(double *)((long)pdVar29 + lVar25);
                *pdVar48 = *(double *)((long)pdVar29 + lVar25) - *(double *)((long)pdVar44 + lVar25)
                ;
                lVar17 = lVar17 + 2;
                lVar18 = lVar18 + lVar34 * 0x10;
                lVar25 = lVar25 + lVar28 * 0x10;
                iVar23 = iVar23 + iVar1 * -2;
                pdVar48 = pdVar48 + lVar34 * -2;
              } while (lVar17 <= lVar54);
            }
            uVar31 = uVar31 + 1;
            pdVar38 = pdVar38 + lVar45;
            pdVar29 = pdVar29 + lVar41;
            pdVar44 = pdVar44 + lVar41;
            iVar15 = iVar15 + iVar1 * iVar3 * iVar2;
            local_148 = local_148 + lVar45;
            pdVar32 = pdVar32 + lVar41;
            pdVar26 = pdVar26 + lVar41;
            pdVar19 = pdVar19 + lVar45;
          } while (uVar31 != uVar5 + 1);
        }
        uVar37 = uVar37 + 1;
        local_d0 = local_d0 + lVar47 * 2;
        local_168 = local_168 + -lVar24;
        local_128 = local_128 + lVar24;
        iVar14 = iVar14 + iVar1 * iVar2 * 2;
        local_d8 = local_d8 + lVar47 * 2;
        local_110 = local_110 + lVar24;
        local_c8 = local_c8 + -lVar24;
        local_a8 = local_a8 + lVar47 * 2;
      } while (uVar37 != iVar30 + 1);
    }
  }
  return 0;
}

Assistant:

int r1fgkf_(int *ido, int *ip, int *l1, int *
	idl1, fft_real_t *cc, fft_real_t *c1, fft_real_t *c2, int *in1, fft_real_t *ch, fft_real_t *ch2,
	 int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int ch_dim1, ch_dim2, ch_dim3, ch_offset, cc_dim1, cc_dim2, cc_dim3,
	    cc_offset, c1_dim1, c1_dim2, c1_dim3, c1_offset, c2_dim1, c2_dim2,
	     c2_offset, ch2_dim1, ch2_dim2, ch2_offset, i__1, i__2, i__3;

    /* Builtin functions */

    /* Local variables */
     int i__, j, k, l, j2, ic, jc, lc, ik, is;
     fft_real_t dc2, ai1, ai2, ar1, ar2, ds2;
     int nbd;
     fft_real_t dcp, arg, dsp, tpi, ar1h, ar2h;
     int idp2, ipp2, idij, ipph;


    /* Parameter adjustments */
    --wa;
    c2_dim1 = *in1;
    c2_dim2 = *idl1;
    c2_offset = 1 + c2_dim1 * (1 + c2_dim2);
    c2 -= c2_offset;
    c1_dim1 = *in1;
    c1_dim2 = *ido;
    c1_dim3 = *l1;
    c1_offset = 1 + c1_dim1 * (1 + c1_dim2 * (1 + c1_dim3));
    c1 -= c1_offset;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_dim3 = *ip;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch2_dim1 = *in2;
    ch2_dim2 = *idl1;
    ch2_offset = 1 + ch2_dim1 * (1 + ch2_dim2);
    ch2 -= ch2_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_dim3 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    tpi = atan(1.0) * 8.0;
    arg = tpi / (fft_real_t) (*ip);
    dcp = cos(arg);
    dsp = sin(arg);
    ipph = (*ip + 1) / 2;
    ipp2 = *ip + 2;
    idp2 = *ido + 2;
    nbd = (*ido - 1) / 2;
    if (*ido == 1) {
	goto L119;
    }
    i__1 = *idl1;
    for (ik = 1; ik <= i__1; ++ik) {
	ch2[(ik + ch2_dim2) * ch2_dim1 + 1] = c2[(ik + c2_dim2) * c2_dim1 + 1]
		;
/* L101: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[((k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = c1[((k + j *
		     c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1];
/* L102: */
	}
/* L103: */
    }
    if (nbd > *l1) {
	goto L107;
    }
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	idij = is;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    idij += 2;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			wa[idij - 1] * c1[(i__ - 1 + (k + j * c1_dim3) *
			c1_dim2) * c1_dim1 + 1] + wa[idij] * c1[(i__ + (k + j
			* c1_dim3) * c1_dim2) * c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = wa[
			idij - 1] * c1[(i__ + (k + j * c1_dim3) * c1_dim2) *
			c1_dim1 + 1] - wa[idij] * c1[(i__ - 1 + (k + j *
			c1_dim3) * c1_dim2) * c1_dim1 + 1];
/* L104: */
	    }
/* L105: */
	}
/* L106: */
    }
    goto L111;
L107:
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    idij = is;
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		idij += 2;
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			wa[idij - 1] * c1[(i__ - 1 + (k + j * c1_dim3) *
			c1_dim2) * c1_dim1 + 1] + wa[idij] * c1[(i__ + (k + j
			* c1_dim3) * c1_dim2) * c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = wa[
			idij - 1] * c1[(i__ + (k + j * c1_dim3) * c1_dim2) *
			c1_dim1 + 1] - wa[idij] * c1[(i__ - 1 + (k + j *
			c1_dim3) * c1_dim2) * c1_dim1 + 1];
/* L108: */
	    }
/* L109: */
	}
/* L110: */
    }
L111:
    if (nbd < *l1) {
	goto L115;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1
			+ 1] + ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
		c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			- ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] +
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			;
		c1[(i__ + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
/* L112: */
	    }
/* L113: */
	}
/* L114: */
    }
    goto L121;
L115:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1
			+ 1] + ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
		c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			- ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] +
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			;
		c1[(i__ + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
/* L116: */
	    }
/* L117: */
	}
/* L118: */
    }
    goto L121;
L119:
    i__1 = *idl1;
    for (ik = 1; ik <= i__1; ++ik) {
	c2[(ik + c2_dim2) * c2_dim1 + 1] = ch2[(ik + ch2_dim2) * ch2_dim1 + 1]
		;
/* L120: */
    }
L121:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    c1[((k + j * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] = ch[((k + j *
		     ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] + ch[((k + jc *
		    ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
	    c1[((k + jc * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] = ch[((k +
		    jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] - ch[((k + j *
		     ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
/* L122: */
	}
/* L123: */
    }

    ar1 = 1.0;
    ai1 = 0.0;
    i__1 = ipph;
    for (l = 2; l <= i__1; ++l) {
	lc = ipp2 - l;
	ar1h = dcp * ar1 - dsp * ai1;
	ai1 = dcp * ai1 + dsp * ar1;
	ar1 = ar1h;
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    ch2[(ik + l * ch2_dim2) * ch2_dim1 + 1] = c2[(ik + c2_dim2) *
		    c2_dim1 + 1] + ar1 * c2[(ik + (c2_dim2 << 1)) * c2_dim1 +
		    1];
	    ch2[(ik + lc * ch2_dim2) * ch2_dim1 + 1] = ai1 * c2[(ik + *ip *
		    c2_dim2) * c2_dim1 + 1];
/* L124: */
	}
	dc2 = ar1;
	ds2 = ai1;
	ar2 = ar1;
	ai2 = ai1;
	i__2 = ipph;
	for (j = 3; j <= i__2; ++j) {
	    jc = ipp2 - j;
	    ar2h = dc2 * ar2 - ds2 * ai2;
	    ai2 = dc2 * ai2 + ds2 * ar2;
	    ar2 = ar2h;
	    i__3 = *idl1;
	    for (ik = 1; ik <= i__3; ++ik) {
		ch2[(ik + l * ch2_dim2) * ch2_dim1 + 1] += ar2 * c2[(ik + j *
			c2_dim2) * c2_dim1 + 1];
		ch2[(ik + lc * ch2_dim2) * ch2_dim1 + 1] += ai2 * c2[(ik + jc
			* c2_dim2) * c2_dim1 + 1];
/* L125: */
	    }
/* L126: */
	}
/* L127: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    ch2[(ik + ch2_dim2) * ch2_dim1 + 1] += c2[(ik + j * c2_dim2) *
		    c2_dim1 + 1];
/* L128: */
	}
/* L129: */
    }

    if (*ido < *l1) {
	goto L132;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    cc[(i__ + (k * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = ch[(i__ +
		    (k + ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L130: */
	}
/* L131: */
    }
    goto L135;
L132:
    i__1 = *ido;
    for (i__ = 1; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(i__ + (k * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = ch[(i__ +
		    (k + ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L133: */
	}
/* L134: */
    }
L135:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(*ido + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] = ch[(
		    (k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
	    cc[((j2 - 1 + k * cc_dim3) * cc_dim2 + 1) * cc_dim1 + 1] = ch[((k
		    + jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
/* L136: */
	}
/* L137: */
    }
    if (*ido == 1) {
	return 0;
    }
    if (nbd < *l1) {
	goto L141;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		ic = idp2 - i__;
		cc[(i__ - 1 + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			 = ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(ic - 1 + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			= ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] - ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(i__ + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			+ ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		cc[(ic + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
/* L138: */
	    }
/* L139: */
	}
/* L140: */
    }
    return 0;
L141:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		cc[(i__ - 1 + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			 = ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(ic - 1 + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			= ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] - ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(i__ + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			+ ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		cc[(ic + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
/* L142: */
	    }
/* L143: */
	}
/* L144: */
    }
    return 0;
}